

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::ConfigBlockSymbol::checkUnusedRules(ConfigBlockSymbol *this)

{
  ConfigRule *pCVar1;
  uint uVar2;
  ushort uVar3;
  char_pointer puVar4;
  char_pointer puVar5;
  char_pointer puVar6;
  char_pointer puVar7;
  char_pointer puVar8;
  char_pointer puVar9;
  char_pointer puVar10;
  char_pointer puVar11;
  table_element_pointer ppVar12;
  table_element_pointer ppVar13;
  table_element_pointer ppVar14;
  char_pointer puVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  iterator iVar22;
  iterator iVar23;
  SourceRange SVar24;
  iterator iVar25;
  
  if (this->resolved == false) {
    resolve(this);
  }
  iVar22 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
           ::begin(&(this->cellOverrides).table_);
  if (iVar22.p_ != (table_element_pointer)0x0) {
LAB_00164afd:
    do {
      pCVar1 = ((iVar22.p_)->second).defaultRule;
      if ((pCVar1 != (ConfigRule *)0x0) && (pCVar1->isUsed == false)) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange((pCVar1->syntax).ptr);
        Scope::addDiag(&this->super_Scope,(DiagCode)0xfd0006,SVar24);
      }
      iVar25 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                        *)&(iVar22.p_)->second);
      if (iVar25.p_ != (table_element_pointer)0x0) {
LAB_00164b82:
        do {
          pCVar1 = (iVar25.p_)->second;
          if (pCVar1->isUsed == false) {
            SVar24 = slang::syntax::SyntaxNode::sourceRange((pCVar1->syntax).ptr);
            Scope::addDiag(&this->super_Scope,(DiagCode)0xfd0006,SVar24);
          }
          puVar9 = iVar25.pc_ + 0x12;
          puVar10 = iVar25.pc_ + 2;
LAB_00164bb7:
          puVar6 = puVar10;
          puVar10 = iVar25.pc_;
          ppVar12 = iVar25.p_ + 1;
          if (((uint)iVar25.pc_ & 0xf) != 0xe) goto code_r0x00164bc5;
          auVar18[0] = -(*puVar6 == '\0');
          auVar18[1] = -(puVar6[1] == '\0');
          auVar18[2] = -(puVar6[2] == '\0');
          auVar18[3] = -(puVar6[3] == '\0');
          auVar18[4] = -(puVar6[4] == '\0');
          auVar18[5] = -(puVar6[5] == '\0');
          auVar18[6] = -(puVar6[6] == '\0');
          auVar18[7] = -(puVar6[7] == '\0');
          auVar18[8] = -(puVar6[8] == '\0');
          auVar18[9] = -(puVar6[9] == '\0');
          auVar18[10] = -(puVar6[10] == '\0');
          auVar18[0xb] = -(puVar6[0xb] == '\0');
          auVar18[0xc] = -(puVar6[0xc] == '\0');
          auVar18[0xd] = -(puVar6[0xd] == '\0');
          auVar18[0xe] = -(puVar6[0xe] == '\0');
          auVar18[0xf] = -(puVar6[0xf] == '\0');
          uVar3 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
          while (uVar3 == 0x7fff) {
            ppVar12 = ppVar12 + 0xf;
            auVar19[0] = -(*puVar9 == '\0');
            auVar19[1] = -(puVar9[1] == '\0');
            auVar19[2] = -(puVar9[2] == '\0');
            auVar19[3] = -(puVar9[3] == '\0');
            auVar19[4] = -(puVar9[4] == '\0');
            auVar19[5] = -(puVar9[5] == '\0');
            auVar19[6] = -(puVar9[6] == '\0');
            auVar19[7] = -(puVar9[7] == '\0');
            auVar19[8] = -(puVar9[8] == '\0');
            auVar19[9] = -(puVar9[9] == '\0');
            auVar19[10] = -(puVar9[10] == '\0');
            auVar19[0xb] = -(puVar9[0xb] == '\0');
            auVar19[0xc] = -(puVar9[0xc] == '\0');
            auVar19[0xd] = -(puVar9[0xd] == '\0');
            auVar19[0xe] = -(puVar9[0xe] == '\0');
            auVar19[0xf] = -(puVar9[0xf] == '\0');
            puVar6 = puVar9;
            puVar9 = puVar9 + 0x10;
            uVar3 = (ushort)(SUB161(auVar19 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
          }
          uVar2 = 0;
          if ((uVar3 ^ 0x7fff) != 0) {
            for (; ((uVar3 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          if (puVar6[uVar2] == '\x01') break;
          iVar25.p_ = (table_element_pointer)((long)&ppVar12->first + (ulong)(uVar2 << 4));
          iVar25.pc_ = puVar6 + uVar2;
        } while( true );
      }
LAB_00164b3a:
      puVar8 = iVar22.pc_ + 0x12;
      puVar11 = iVar22.pc_ + 2;
LAB_00164b46:
      puVar5 = puVar11;
      puVar11 = iVar22.pc_;
      ppVar14 = iVar22.p_ + 1;
      if (((uint)iVar22.pc_ & 0xf) != 0xe) goto code_r0x00164b59;
      auVar20[0] = -(*puVar5 == '\0');
      auVar20[1] = -(puVar5[1] == '\0');
      auVar20[2] = -(puVar5[2] == '\0');
      auVar20[3] = -(puVar5[3] == '\0');
      auVar20[4] = -(puVar5[4] == '\0');
      auVar20[5] = -(puVar5[5] == '\0');
      auVar20[6] = -(puVar5[6] == '\0');
      auVar20[7] = -(puVar5[7] == '\0');
      auVar20[8] = -(puVar5[8] == '\0');
      auVar20[9] = -(puVar5[9] == '\0');
      auVar20[10] = -(puVar5[10] == '\0');
      auVar20[0xb] = -(puVar5[0xb] == '\0');
      auVar20[0xc] = -(puVar5[0xc] == '\0');
      auVar20[0xd] = -(puVar5[0xd] == '\0');
      auVar20[0xe] = -(puVar5[0xe] == '\0');
      auVar20[0xf] = -(puVar5[0xf] == '\0');
      uVar3 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe;
      while (uVar3 == 0x7fff) {
        ppVar14 = ppVar14 + 0xf;
        auVar21[0] = -(*puVar8 == '\0');
        auVar21[1] = -(puVar8[1] == '\0');
        auVar21[2] = -(puVar8[2] == '\0');
        auVar21[3] = -(puVar8[3] == '\0');
        auVar21[4] = -(puVar8[4] == '\0');
        auVar21[5] = -(puVar8[5] == '\0');
        auVar21[6] = -(puVar8[6] == '\0');
        auVar21[7] = -(puVar8[7] == '\0');
        auVar21[8] = -(puVar8[8] == '\0');
        auVar21[9] = -(puVar8[9] == '\0');
        auVar21[10] = -(puVar8[10] == '\0');
        auVar21[0xb] = -(puVar8[0xb] == '\0');
        auVar21[0xc] = -(puVar8[0xc] == '\0');
        auVar21[0xd] = -(puVar8[0xd] == '\0');
        auVar21[0xe] = -(puVar8[0xe] == '\0');
        auVar21[0xf] = -(puVar8[0xf] == '\0');
        puVar5 = puVar8;
        puVar8 = puVar8 + 0x10;
        uVar3 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe;
      }
      uVar2 = 0;
      if ((uVar3 ^ 0x7fff) != 0) {
        for (; ((uVar3 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (puVar5[uVar2] == '\x01') break;
      iVar22.p_ = ppVar14 + uVar2;
      iVar22.pc_ = puVar5 + uVar2;
    } while( true );
  }
LAB_001649fc:
  if (this->resolved == false) {
    resolve(this);
  }
  iVar23 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin(&(this->instanceOverrides).table_);
  if (iVar23.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_00164a38:
  do {
    checkNodeUnused(&this->super_Scope,&(iVar23.p_)->second);
    puVar7 = iVar23.pc_ + 0x12;
    puVar15 = iVar23.pc_ + 2;
    while( true ) {
      puVar4 = puVar15;
      puVar15 = iVar23.pc_;
      ppVar13 = iVar23.p_ + 1;
      if (((uint)iVar23.pc_ & 0xf) == 0xe) break;
      iVar23.p_ = ppVar13;
      iVar23.pc_ = puVar15 + 1;
      puVar7 = puVar7 + 1;
      puVar15 = puVar4 + 1;
      if (puVar4[-1] != '\0') goto code_r0x00164a73;
    }
    auVar16[0] = -(*puVar4 == '\0');
    auVar16[1] = -(puVar4[1] == '\0');
    auVar16[2] = -(puVar4[2] == '\0');
    auVar16[3] = -(puVar4[3] == '\0');
    auVar16[4] = -(puVar4[4] == '\0');
    auVar16[5] = -(puVar4[5] == '\0');
    auVar16[6] = -(puVar4[6] == '\0');
    auVar16[7] = -(puVar4[7] == '\0');
    auVar16[8] = -(puVar4[8] == '\0');
    auVar16[9] = -(puVar4[9] == '\0');
    auVar16[10] = -(puVar4[10] == '\0');
    auVar16[0xb] = -(puVar4[0xb] == '\0');
    auVar16[0xc] = -(puVar4[0xc] == '\0');
    auVar16[0xd] = -(puVar4[0xd] == '\0');
    auVar16[0xe] = -(puVar4[0xe] == '\0');
    auVar16[0xf] = -(puVar4[0xf] == '\0');
    uVar3 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    while (uVar3 == 0x7fff) {
      ppVar13 = ppVar13 + 0xf;
      auVar17[0] = -(*puVar7 == '\0');
      auVar17[1] = -(puVar7[1] == '\0');
      auVar17[2] = -(puVar7[2] == '\0');
      auVar17[3] = -(puVar7[3] == '\0');
      auVar17[4] = -(puVar7[4] == '\0');
      auVar17[5] = -(puVar7[5] == '\0');
      auVar17[6] = -(puVar7[6] == '\0');
      auVar17[7] = -(puVar7[7] == '\0');
      auVar17[8] = -(puVar7[8] == '\0');
      auVar17[9] = -(puVar7[9] == '\0');
      auVar17[10] = -(puVar7[10] == '\0');
      auVar17[0xb] = -(puVar7[0xb] == '\0');
      auVar17[0xc] = -(puVar7[0xc] == '\0');
      auVar17[0xd] = -(puVar7[0xd] == '\0');
      auVar17[0xe] = -(puVar7[0xe] == '\0');
      auVar17[0xf] = -(puVar7[0xf] == '\0');
      puVar4 = puVar7;
      puVar7 = puVar7 + 0x10;
      uVar3 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
    }
    uVar2 = 0;
    if ((uVar3 ^ 0x7fff) != 0) {
      for (; ((uVar3 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    if (puVar4[uVar2] == '\x01') {
      return;
    }
    iVar23.p_ = ppVar13 + uVar2;
    iVar23.pc_ = puVar4 + uVar2;
  } while( true );
code_r0x00164bc5:
  iVar25.p_ = ppVar12;
  iVar25.pc_ = puVar10 + 1;
  puVar9 = puVar9 + 1;
  puVar10 = puVar6 + 1;
  if (puVar6[-1] != '\0') goto code_r0x00164bd6;
  goto LAB_00164bb7;
code_r0x00164bd6:
  if (puVar6[-1] == '\x01') goto LAB_00164b3a;
  iVar25.pc_ = puVar6 + -1;
  goto LAB_00164b82;
code_r0x00164b59:
  iVar22.p_ = ppVar14;
  iVar22.pc_ = puVar11 + 1;
  puVar8 = puVar8 + 1;
  puVar11 = puVar5 + 1;
  if (puVar5[-1] != '\0') goto code_r0x00164b6a;
  goto LAB_00164b46;
code_r0x00164b6a:
  if (puVar5[-1] == '\x01') goto LAB_001649fc;
  iVar22.pc_ = puVar5 + -1;
  goto LAB_00164afd;
code_r0x00164a73:
  if (puVar4[-1] == '\x01') {
    return;
  }
  iVar23.pc_ = puVar4 + -1;
  goto LAB_00164a38;
}

Assistant:

void ConfigBlockSymbol::checkUnusedRules() const {
    for (auto& [_, cellOverride] : getCellOverrides()) {
        if (cellOverride.defaultRule)
            checkRuleUnused(*this, *cellOverride.defaultRule, true);

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            checkRuleUnused(*this, *rule, true);
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        checkNodeUnused(*this, instOverride);
}